

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

QualifiedColumnName *
duckdb::QualifiedColumnName::Deserialize
          (QualifiedColumnName *__return_storage_ptr__,Deserializer *deserializer)

{
  uint uVar1;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  QualifiedColumnName(__return_storage_ptr__);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"catalog");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 != local_40) goto LAB_01772d20;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    if (local_50 != local_40) {
LAB_01772d20:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"schema");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->schema,(string *)&local_50)
    ;
    if (local_50 != local_40) goto LAB_01772db1;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->schema,(string *)&local_50)
    ;
    if (local_50 != local_40) {
LAB_01772db1:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"table");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->table,(string *)&local_50);
    if (local_50 != local_40) goto LAB_01772e42;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->table,(string *)&local_50);
    if (local_50 != local_40) {
LAB_01772e42:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"column");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->column,(string *)&local_50)
    ;
    if (local_50 == local_40) goto LAB_01772ed8;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->column,(string *)&local_50)
    ;
    if (local_50 == local_40) goto LAB_01772ed8;
  }
  operator_delete(local_50);
LAB_01772ed8:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

QualifiedColumnName QualifiedColumnName::Deserialize(Deserializer &deserializer) {
	QualifiedColumnName result;
	deserializer.ReadPropertyWithDefault<string>(100, "catalog", result.catalog);
	deserializer.ReadPropertyWithDefault<string>(101, "schema", result.schema);
	deserializer.ReadPropertyWithDefault<string>(102, "table", result.table);
	deserializer.ReadPropertyWithDefault<string>(103, "column", result.column);
	return result;
}